

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreter::pushLongReceiverVariable(StackInterpreter *this,size_t receiverVarIndex)

{
  long *plVar1;
  ulong uVar2;
  uint8_t *puVar3;
  StackMemory *pSVar4;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  undefined8 *puVar8;
  StackFrame previousFrame;
  StackFrame local_20;
  
  pSVar4 = this->stack;
  plVar1 = (long *)(pSVar4->stackFrame).framePointer;
  if (receiverVarIndex < 6) {
    puVar5 = (undefined8 *)plVar1[-4];
    if ((((((ulong)puVar5 & 1) != 0) || (uVar7 = (uint)puVar5 & 6, uVar7 == 2)) || (uVar7 == 4)) ||
       ((uint)((ulong)*puVar5 >> 0x2a) != 0x5c)) goto LAB_001494c7;
    uVar2 = puVar5[1];
    if ((uVar2 & 1) != 0) {
      if (receiverVarIndex == 1) {
        if ((long *)(uVar2 - 1) == plVar1) {
          lVar6 = this->pc * 2 + 1;
          goto LAB_001494db;
        }
      }
      else if (receiverVarIndex == 0) {
        local_20.framePointer = *(uint8_t **)(uVar2 - 1);
        if (local_20.framePointer == (uint8_t *)0x0) {
          puVar3 = (pSVar4->stackFrame).stackPointer;
          (pSVar4->stackFrame).stackPointer = puVar3 + -8;
          *(undefined8 **)(puVar3 + -8) = &NilObject;
          return;
        }
        local_20.stackPointer =
             (uint8_t *)(uVar2 + (ulong)(*(uint *)(uVar2 - 0x11) & 0xff) * 8 + 0x17);
        if (local_20.framePointer[-0xe] == '\0') {
          StackFrame::marryFrame(&local_20,this->context);
          pSVar4 = this->stack;
        }
        lVar6 = *(long *)(local_20.framePointer + -0x18);
        goto LAB_001494db;
      }
      goto LAB_001494c7;
    }
    uVar2 = (ulong)puVar5 & 6;
  }
  else {
    puVar5 = (undefined8 *)plVar1[-4];
LAB_001494c7:
    uVar2 = (ulong)puVar5 & 7;
  }
  puVar8 = (undefined8 *)0x0;
  if (uVar2 == 0) {
    puVar8 = puVar5 + 1;
  }
  lVar6 = puVar8[receiverVarIndex];
LAB_001494db:
  puVar3 = (pSVar4->stackFrame).stackPointer;
  (pSVar4->stackFrame).stackPointer = puVar3 + -8;
  *(long *)(puVar3 + -8) = lVar6;
  return;
}

Assistant:

void pushLongReceiverVariable(size_t receiverVarIndex)
    {
        if(receiverVarIndex <= 5 && classIndexOf(currentReceiver()) == SCI_Context)
        {
            auto context = reinterpret_cast<Context*> (currentReceiver().pointer);
            if (!context->isMarriedOrWidowed())
                return pushReceiverVariable(receiverVarIndex);

            // TODO: Perform expensive check for widowed context.
            auto contextFP = context->sender.pointer - 1;
            StackFrame contextFrame(contextFP);
            auto prevFP = contextFrame.getPrevFramePointer();

            switch (receiverVarIndex)
            {
            case Context::SenderIndex:
            {
                if (!prevFP)
                {
                    pushOop(nilOop());
                }
                else
                {
                    auto previousFrame = contextFrame.getPreviousFrame();
                    previousFrame.ensureFrameIsMarried(this->context);
                    pushOop(previousFrame.getThisContext());
                }
                return;
            }
                break;
            case Context::PCIndex:
                if (contextFP == stack->getFramePointer())
                    return pushSmallIntegerObject(pc);
                break;
            case Context::StackPointerIndex:
                break;
            }
            auto value = getInstanceVariable(receiverVarIndex);
            //printf("get context var %d %p\n", (int)receiverVarIndex, value.pointer);
        }

        pushReceiverVariable(receiverVarIndex);
    }